

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

bool __thiscall
ON_Annotation::GetTextXform
          (ON_Annotation *this,ON_Xform *model_xform,ON_Viewport *vp,ON_DimStyle *dimstyle,
          double dimscale,ON_Xform *text_xform_out)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  ON_Text *this_00;
  ON_Leader *this_01;
  ON_DimLinear *this_02;
  ON_DimAngular *this_03;
  ON_DimRadial *this_04;
  ON_DimOrdinate *this_05;
  ON_Centermark *pOVar3;
  
  this_00 = ON_Text::Cast((ON_Object *)this);
  if (this_00 != (ON_Text *)0x0) {
    bVar1 = ON_Text::GetTextXform(this_00,model_xform,vp,dimstyle,dimscale,text_xform_out);
    return bVar1;
  }
  this_01 = ON_Leader::Cast((ON_Object *)this);
  if (this_01 != (ON_Leader *)0x0) {
    bVar1 = ON_Leader::GetTextXform(this_01,model_xform,vp,dimstyle,dimscale,text_xform_out);
    return bVar1;
  }
  this_02 = ON_DimLinear::Cast((ON_Object *)this);
  if (this_02 != (ON_DimLinear *)0x0) {
    bVar1 = ON_DimLinear::GetTextXform(this_02,model_xform,vp,dimstyle,dimscale,text_xform_out);
    return bVar1;
  }
  this_03 = ON_DimAngular::Cast((ON_Object *)this);
  if (this_03 != (ON_DimAngular *)0x0) {
    bVar1 = ON_DimAngular::GetTextXform(this_03,model_xform,vp,dimstyle,dimscale,text_xform_out);
    return bVar1;
  }
  this_04 = ON_DimRadial::Cast((ON_Object *)this);
  if (this_04 != (ON_DimRadial *)0x0) {
    bVar1 = ON_DimRadial::GetTextXform(this_04,model_xform,vp,dimstyle,dimscale,text_xform_out);
    return bVar1;
  }
  this_05 = ON_DimOrdinate::Cast((ON_Object *)this);
  if (this_05 != (ON_DimOrdinate *)0x0) {
    bVar1 = ON_DimOrdinate::GetTextXform(this_05,model_xform,vp,dimstyle,dimscale,text_xform_out);
    return bVar1;
  }
  pOVar3 = ON_Centermark::Cast((ON_Object *)this);
  if (pOVar3 != (ON_Centermark *)0x0) {
    UNRECOVERED_JUMPTABLE =
         (pOVar3->super_ON_Dimension).super_ON_Annotation.super_ON_Geometry.super_ON_Object.
         _vptr_ON_Object[0x25];
    iVar2 = (*UNRECOVERED_JUMPTABLE)
                      (dimscale,pOVar3,vp,dimstyle,text_xform_out,UNRECOVERED_JUMPTABLE);
    return SUB41(iVar2,0);
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_annotationbase.cpp"
             ,0x222,"","Annotation type not handled");
  return false;
}

Assistant:

bool ON_Annotation::GetTextXform(
  const ON_Xform* model_xform,
  const ON_Viewport* vp,
  const ON_DimStyle* dimstyle,
  double dimscale,
  ON_Xform& text_xform_out
) const
{
  const ON_Text* pText = ON_Text::Cast(this);
  if (nullptr != pText)
    return pText->GetTextXform(model_xform, vp, dimstyle, dimscale, text_xform_out);

  const ON_Leader* pLeader = ON_Leader::Cast(this);
  if (nullptr != pLeader)
    return pLeader->GetTextXform(model_xform, vp, dimstyle, dimscale, text_xform_out);

  const ON_DimLinear* pDimLinear = ON_DimLinear::Cast(this);
  if (nullptr != pDimLinear)
    return pDimLinear->GetTextXform(model_xform, vp, dimstyle, dimscale, text_xform_out);

  const ON_DimAngular* pDimAngular = ON_DimAngular::Cast(this);
  if (nullptr != pDimAngular)
    return pDimAngular->GetTextXform(model_xform, vp, dimstyle, dimscale, text_xform_out);

  const ON_DimRadial* pDimRadial = ON_DimRadial::Cast(this);
  if (nullptr != pDimRadial)
    return pDimRadial->GetTextXform(model_xform, vp, dimstyle, dimscale, text_xform_out);

  const ON_DimOrdinate* pDimOrdinate = ON_DimOrdinate::Cast(this);
  if (nullptr != pDimOrdinate)
    return pDimOrdinate->GetTextXform(model_xform, vp, dimstyle, dimscale, text_xform_out);

  const ON_Centermark* pCentermark = ON_Centermark::Cast(this);
  if (nullptr != pCentermark)
    return pCentermark->GetTextXform(vp, dimstyle, dimscale, text_xform_out);

  ON_ERROR("Annotation type not handled");
  return false;
}